

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::FeatureDescription::clear_type(FeatureDescription *this)

{
  ulong uVar1;
  FeatureType *this_00;
  undefined8 *puVar2;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) && (this_00 = this->type_, this_00 != (FeatureType *)0x0)) {
    FeatureType::~FeatureType(this_00);
    operator_delete(this_00,0x28);
  }
  this->type_ = (FeatureType *)0x0;
  return;
}

Assistant:

void FeatureDescription::clear_type() {
  if (GetArenaForAllocation() == nullptr && type_ != nullptr) {
    delete type_;
  }
  type_ = nullptr;
}